

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

void mbedtls_ecp_keypair_init(mbedtls_ecp_keypair *key)

{
  mbedtls_ecp_group_init(&key->grp);
  mbedtls_mpi_init(&key->d);
  mbedtls_mpi_init(&(key->Q).X);
  mbedtls_mpi_init(&(key->Q).Y);
  mbedtls_mpi_init(&(key->Q).Z);
  return;
}

Assistant:

void mbedtls_ecp_keypair_init(mbedtls_ecp_keypair *key)
{
    mbedtls_ecp_group_init(&key->grp);
    mbedtls_mpi_init(&key->d);
    mbedtls_ecp_point_init(&key->Q);
}